

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void calcNodesMatricesRecursive(cgltf_node *node,mat4 *parentMat)

{
  mat4 *parentMat_00;
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  float *pfVar73;
  cgltf_size cVar74;
  cgltf_node **ppcVar75;
  cgltf_node *node_00;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  int iVar83;
  long lVar84;
  char *__function;
  cgltf_float *pcVar85;
  qua<float,_(glm::qualifier)0> *x;
  undefined8 *puVar86;
  long lVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined8 local_198;
  undefined8 uStack_190;
  qua<float,_(glm::qualifier)0> local_70;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  lVar87 = anims::nodesMatrices;
  iVar83 = (int)((long)node - (long)parsedData->nodes >> 3) * 0x684bda13;
  if (anims::playingInd == 0) {
    puVar86 = (undefined8 *)0x0;
  }
  else {
    if (DAT_003fb948 <= (ulong)(long)iVar83) {
      __function = "T &tl::Vector<anims::NodeData>::operator[](size_t) [T = anims::NodeData]";
      goto LAB_001147e9;
    }
    puVar86 = (undefined8 *)((long)iVar83 * 0x18 + anims::nodesData);
  }
  if (DAT_003fb960 <= (ulong)(long)iVar83) {
    __function = 
    "T &tl::Vector<glm::mat<4, 4, float>>::operator[](size_t) [T = glm::mat<4, 4, float>]";
LAB_001147e9:
    __assert_fail("i < _size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                  ,0x2c,__function);
  }
  lVar84 = (long)iVar83 * 0x40;
  parentMat_00 = (mat4 *)(anims::nodesMatrices + lVar84);
  uVar76 = *(undefined8 *)parentMat->value;
  uVar77 = *(undefined8 *)&parentMat->value[0].field_2;
  uVar78 = *(undefined8 *)(parentMat->value + 1);
  uVar79 = *(undefined8 *)&parentMat->value[1].field_2;
  uVar80 = *(undefined8 *)(parentMat->value + 2);
  uVar81 = *(undefined8 *)&parentMat->value[2].field_2;
  uVar82 = *(undefined8 *)&parentMat->value[3].field_2;
  puVar1 = (undefined8 *)(anims::nodesMatrices + 0x30 + lVar84);
  *puVar1 = *(undefined8 *)(parentMat->value + 3);
  puVar1[1] = uVar82;
  puVar1 = (undefined8 *)(lVar87 + 0x20 + lVar84);
  *puVar1 = uVar80;
  puVar1[1] = uVar81;
  puVar1 = (undefined8 *)(lVar87 + 0x10 + lVar84);
  *puVar1 = uVar78;
  puVar1[1] = uVar79;
  *(undefined8 *)(lVar87 + lVar84) = uVar76;
  ((undefined8 *)(lVar87 + lVar84))[1] = uVar77;
  if (node->has_matrix != 0) {
    fVar88 = node->matrix[0];
    fVar93 = node->matrix[1];
    fVar89 = node->matrix[2];
    uVar9 = parentMat_00->value[0].field_0;
    uVar41 = parentMat_00->value[0].field_1;
    uVar10 = parentMat_00->value[0].field_2;
    uVar42 = parentMat_00->value[0].field_3;
    uVar11 = parentMat_00->value[1].field_0;
    uVar43 = parentMat_00->value[1].field_1;
    uVar12 = parentMat_00->value[1].field_2;
    uVar44 = parentMat_00->value[1].field_3;
    uVar13 = parentMat_00->value[2].field_0;
    uVar45 = parentMat_00->value[2].field_1;
    uVar14 = parentMat_00->value[2].field_2;
    uVar46 = parentMat_00->value[2].field_3;
    fVar90 = node->matrix[3];
    uVar15 = parentMat_00->value[3].field_0;
    uVar47 = parentMat_00->value[3].field_1;
    uVar16 = parentMat_00->value[3].field_2;
    uVar48 = parentMat_00->value[3].field_3;
    fVar91 = node->matrix[4];
    fVar92 = node->matrix[5];
    fVar94 = node->matrix[6];
    fVar95 = node->matrix[7];
    fVar96 = node->matrix[8];
    fVar2 = node->matrix[9];
    fVar3 = node->matrix[10];
    fVar4 = node->matrix[0xb];
    fVar5 = node->matrix[0xc];
    fVar6 = node->matrix[0xd];
    fVar7 = node->matrix[0xe];
    fVar8 = node->matrix[0xf];
    parentMat_00->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         (fVar90 * (float)uVar15 +
         fVar89 * (float)uVar13 + fVar93 * (float)uVar11 + fVar88 * (float)uVar9);
    parentMat_00->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         (fVar90 * (float)uVar47 +
         fVar89 * (float)uVar45 + fVar93 * (float)uVar43 + fVar88 * (float)uVar41);
    parentMat_00->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         (fVar90 * (float)uVar16 +
         fVar89 * (float)uVar14 + fVar93 * (float)uVar12 + fVar88 * (float)uVar10);
    parentMat_00->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         (fVar90 * (float)uVar48 +
         fVar89 * (float)uVar46 + fVar93 * (float)uVar44 + fVar88 * (float)uVar42);
    parentMat_00->value[1].field_0.x =
         fVar95 * (float)uVar15 +
         fVar94 * (float)uVar13 + fVar92 * (float)uVar11 + fVar91 * (float)uVar9;
    parentMat_00->value[1].field_1.y =
         fVar95 * (float)uVar47 +
         fVar94 * (float)uVar45 + fVar92 * (float)uVar43 + fVar91 * (float)uVar41;
    parentMat_00->value[1].field_2.z =
         fVar95 * (float)uVar16 +
         fVar94 * (float)uVar14 + fVar92 * (float)uVar12 + fVar91 * (float)uVar10;
    parentMat_00->value[1].field_3.w =
         fVar95 * (float)uVar48 +
         fVar94 * (float)uVar46 + fVar92 * (float)uVar44 + fVar91 * (float)uVar42;
    parentMat_00->value[2].field_0.x =
         fVar4 * (float)uVar15 +
         fVar3 * (float)uVar13 + fVar2 * (float)uVar11 + fVar96 * (float)uVar9;
    parentMat_00->value[2].field_1.y =
         fVar4 * (float)uVar47 +
         fVar3 * (float)uVar45 + fVar2 * (float)uVar43 + fVar96 * (float)uVar41;
    parentMat_00->value[2].field_2.z =
         fVar4 * (float)uVar16 +
         fVar3 * (float)uVar14 + fVar2 * (float)uVar12 + fVar96 * (float)uVar10;
    parentMat_00->value[2].field_3.w =
         fVar4 * (float)uVar48 +
         fVar3 * (float)uVar46 + fVar2 * (float)uVar44 + fVar96 * (float)uVar42;
    parentMat_00->value[3].field_0.x =
         (float)uVar15 * fVar8 +
         (float)uVar13 * fVar7 + (float)uVar11 * fVar6 + (float)uVar9 * fVar5;
    parentMat_00->value[3].field_1.y =
         (float)uVar47 * fVar8 +
         (float)uVar45 * fVar7 + (float)uVar43 * fVar6 + (float)uVar41 * fVar5;
    parentMat_00->value[3].field_2.z =
         (float)uVar16 * fVar8 +
         (float)uVar14 * fVar7 + (float)uVar12 * fVar6 + (float)uVar10 * fVar5;
    parentMat_00->value[3].field_3.w =
         (float)uVar48 * fVar8 +
         (float)uVar46 * fVar7 + (float)uVar44 * fVar6 + (float)uVar42 * fVar5;
  }
  if ((puVar86 == (undefined8 *)0x0) || (pfVar73 = (float *)*puVar86, pfVar73 == (float *)0x0)) {
    if (node->has_translation != 0) {
      fVar90 = node->translation[0] * 0.0;
      fVar88 = node->translation[1] * 0.0;
      fVar89 = fVar88 + fVar90;
      fVar91 = node->translation[2] * 0.0;
      fVar93 = node->translation[0] + fVar88 + fVar91;
      fVar90 = fVar90 + node->translation[1] + fVar91;
      fVar88 = node->translation[2] + fVar89;
      goto LAB_00113a17;
    }
  }
  else {
    fVar90 = *pfVar73 * 0.0;
    fVar88 = pfVar73[1] * 0.0;
    fVar89 = fVar88 + fVar90;
    fVar91 = pfVar73[2] * 0.0;
    fVar93 = *pfVar73 + fVar88 + fVar91;
    fVar90 = fVar90 + pfVar73[1] + fVar91;
    fVar88 = pfVar73[2] + fVar89;
LAB_00113a17:
    uVar17 = parentMat_00->value[0].field_0;
    uVar49 = parentMat_00->value[0].field_1;
    uVar18 = parentMat_00->value[1].field_0;
    uVar50 = parentMat_00->value[1].field_1;
    uVar19 = parentMat_00->value[2].field_0;
    uVar51 = parentMat_00->value[2].field_1;
    uVar20 = parentMat_00->value[3].field_0;
    uVar52 = parentMat_00->value[3].field_1;
    fVar94 = (float)uVar20 * 0.0;
    fVar92 = (float)uVar52 * 0.0;
    uVar21 = parentMat_00->value[0].field_2;
    uVar53 = parentMat_00->value[0].field_3;
    uVar22 = parentMat_00->value[1].field_2;
    uVar54 = parentMat_00->value[1].field_3;
    uVar23 = parentMat_00->value[2].field_2;
    uVar55 = parentMat_00->value[2].field_3;
    uVar24 = parentMat_00->value[3].field_2;
    uVar56 = parentMat_00->value[3].field_3;
    fVar95 = (float)uVar24 * 0.0;
    fVar96 = (float)uVar56 * 0.0;
    fVar93 = fVar93 + 0.0;
    fVar90 = fVar90 + 0.0;
    fVar88 = fVar88 + 0.0;
    fVar89 = fVar91 + fVar89 + 1.0;
    parentMat_00->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar17 + (float)uVar18 * 0.0 + (float)uVar19 * 0.0 + fVar94);
    parentMat_00->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar49 + (float)uVar50 * 0.0 + (float)uVar51 * 0.0 + fVar92);
    parentMat_00->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ((float)uVar21 + (float)uVar22 * 0.0 + (float)uVar23 * 0.0 + fVar95);
    parentMat_00->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         ((float)uVar53 + (float)uVar54 * 0.0 + (float)uVar55 * 0.0 + fVar96);
    parentMat_00->value[1].field_0.x =
         (float)uVar17 * 0.0 + (float)uVar18 + (float)uVar19 * 0.0 + fVar94;
    parentMat_00->value[1].field_1.y =
         (float)uVar49 * 0.0 + (float)uVar50 + (float)uVar51 * 0.0 + fVar92;
    parentMat_00->value[1].field_2.z =
         (float)uVar21 * 0.0 + (float)uVar22 + (float)uVar23 * 0.0 + fVar95;
    parentMat_00->value[1].field_3.w =
         (float)uVar53 * 0.0 + (float)uVar54 + (float)uVar55 * 0.0 + fVar96;
    parentMat_00->value[2].field_0.x =
         (float)uVar17 * 0.0 + (float)uVar18 * 0.0 + (float)uVar19 + fVar94;
    parentMat_00->value[2].field_1.y =
         (float)uVar49 * 0.0 + (float)uVar50 * 0.0 + (float)uVar51 + fVar92;
    parentMat_00->value[2].field_2.z =
         (float)uVar21 * 0.0 + (float)uVar22 * 0.0 + (float)uVar23 + fVar95;
    parentMat_00->value[2].field_3.w =
         (float)uVar53 * 0.0 + (float)uVar54 * 0.0 + (float)uVar55 + fVar96;
    parentMat_00->value[3].field_0.x =
         (float)uVar20 * fVar89 +
         (float)uVar19 * fVar88 + (float)uVar18 * fVar90 + (float)uVar17 * fVar93;
    parentMat_00->value[3].field_1.y =
         (float)uVar52 * fVar89 +
         (float)uVar51 * fVar88 + (float)uVar50 * fVar90 + (float)uVar49 * fVar93;
    parentMat_00->value[3].field_2.z =
         (float)uVar24 * fVar89 +
         (float)uVar23 * fVar88 + (float)uVar22 * fVar90 + (float)uVar21 * fVar93;
    parentMat_00->value[3].field_3.w =
         (float)uVar56 * fVar89 +
         (float)uVar55 * fVar88 + (float)uVar54 * fVar90 + (float)uVar53 * fVar93;
  }
  if ((puVar86 == (undefined8 *)0x0) || (puVar86[1] == 0)) {
    if (node->has_rotation != 0) {
      local_70.x = node->rotation[0];
      local_70.y = node->rotation[1];
      local_70.z = node->rotation[2];
      local_70.w = node->rotation[3];
      x = &local_70;
      goto LAB_00113e4d;
    }
  }
  else {
    x = (qua<float,_(glm::qualifier)0> *)puVar86[1];
LAB_00113e4d:
    glm::toMat4<float,(glm::qualifier)0>(x);
    uVar25 = parentMat_00->value[0].field_0;
    uVar57 = parentMat_00->value[0].field_1;
    uVar26 = parentMat_00->value[0].field_2;
    uVar58 = parentMat_00->value[0].field_3;
    uVar27 = parentMat_00->value[1].field_0;
    uVar59 = parentMat_00->value[1].field_1;
    uVar28 = parentMat_00->value[1].field_2;
    uVar60 = parentMat_00->value[1].field_3;
    uVar29 = parentMat_00->value[2].field_0;
    uVar61 = parentMat_00->value[2].field_1;
    uVar30 = parentMat_00->value[2].field_2;
    uVar62 = parentMat_00->value[2].field_3;
    uVar31 = parentMat_00->value[3].field_0;
    uVar63 = parentMat_00->value[3].field_1;
    uVar32 = parentMat_00->value[3].field_2;
    uVar64 = parentMat_00->value[3].field_3;
    parentMat_00->value[0].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
         ((float)uVar31 * local_54 +
         (float)uVar29 * local_58 + (float)uVar27 * local_5c + (float)uVar25 * local_60);
    parentMat_00->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
         ((float)uVar63 * local_54 +
         (float)uVar61 * local_58 + (float)uVar59 * local_5c + (float)uVar57 * local_60);
    parentMat_00->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ((float)uVar32 * local_54 +
         (float)uVar30 * local_58 + (float)uVar28 * local_5c + (float)uVar26 * local_60);
    parentMat_00->value[0].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
         (local_54 * (float)uVar64 +
         local_58 * (float)uVar62 + local_5c * (float)uVar60 + local_60 * (float)uVar58);
    parentMat_00->value[1].field_0.x =
         (float)uVar31 * local_44 +
         (float)uVar29 * local_48 + (float)uVar27 * local_4c + (float)uVar25 * local_50;
    parentMat_00->value[1].field_1.y =
         (float)uVar63 * local_44 +
         (float)uVar61 * local_48 + (float)uVar59 * local_4c + (float)uVar57 * local_50;
    parentMat_00->value[1].field_2.z =
         (float)uVar32 * local_44 +
         (float)uVar30 * local_48 + (float)uVar28 * local_4c + (float)uVar26 * local_50;
    parentMat_00->value[1].field_3.w =
         local_44 * (float)uVar64 +
         local_48 * (float)uVar62 + local_4c * (float)uVar60 + local_50 * (float)uVar58;
    parentMat_00->value[2].field_0.x =
         (float)uVar31 * local_34 +
         (float)uVar29 * local_38 + (float)uVar27 * local_3c + (float)uVar25 * local_40;
    parentMat_00->value[2].field_1.y =
         (float)uVar63 * local_34 +
         (float)uVar61 * local_38 + (float)uVar59 * local_3c + (float)uVar57 * local_40;
    parentMat_00->value[2].field_2.z =
         (float)uVar32 * local_34 +
         (float)uVar30 * local_38 + (float)uVar28 * local_3c + (float)uVar26 * local_40;
    parentMat_00->value[2].field_3.w =
         local_34 * (float)uVar64 +
         local_38 * (float)uVar62 + local_3c * (float)uVar60 + local_40 * (float)uVar58;
    parentMat_00->value[3].field_0.x =
         (float)uVar31 * local_24 +
         (float)uVar29 * local_28 + (float)uVar27 * local_2c + (float)uVar25 * local_30;
    parentMat_00->value[3].field_1.y =
         (float)uVar63 * local_24 +
         (float)uVar61 * local_28 + (float)uVar59 * local_2c + (float)uVar57 * local_30;
    parentMat_00->value[3].field_2.z =
         (float)uVar32 * local_24 +
         (float)uVar30 * local_28 + (float)uVar28 * local_2c + (float)uVar26 * local_30;
    parentMat_00->value[3].field_3.w =
         (float)uVar64 * local_24 +
         (float)uVar62 * local_28 + (float)uVar60 * local_2c + (float)uVar58 * local_30;
  }
  if ((puVar86 == (undefined8 *)0x0) ||
     (pcVar85 = (cgltf_float *)puVar86[2], pcVar85 == (cgltf_float *)0x0)) {
    if (node->has_scale == 0) goto LAB_00114761;
    pcVar85 = node->scale;
  }
  fVar88 = *pcVar85;
  fVar90 = fVar88 * 0.0;
  uVar33 = parentMat_00->value[0].field_0;
  uVar65 = parentMat_00->value[0].field_1;
  uVar34 = parentMat_00->value[0].field_2;
  uVar66 = parentMat_00->value[0].field_3;
  uVar35 = parentMat_00->value[1].field_0;
  uVar67 = parentMat_00->value[1].field_1;
  uVar36 = parentMat_00->value[1].field_2;
  uVar68 = parentMat_00->value[1].field_3;
  uVar37 = parentMat_00->value[2].field_0;
  uVar69 = parentMat_00->value[2].field_1;
  uVar38 = parentMat_00->value[2].field_2;
  uVar70 = parentMat_00->value[2].field_3;
  uVar39 = parentMat_00->value[3].field_0;
  uVar71 = parentMat_00->value[3].field_1;
  fVar93 = pcVar85[1];
  fVar91 = fVar93 * 0.0;
  fVar89 = pcVar85[2];
  fVar92 = fVar89 * 0.0;
  uVar40 = parentMat_00->value[3].field_2;
  uVar72 = parentMat_00->value[3].field_3;
  parentMat_00->value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar90 * (float)uVar39 +
       fVar90 * (float)uVar37 + fVar90 * (float)uVar35 + fVar88 * (float)uVar33);
  parentMat_00->value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar90 * (float)uVar71 +
       fVar90 * (float)uVar69 + fVar90 * (float)uVar67 + fVar88 * (float)uVar65);
  parentMat_00->value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar90 * (float)uVar40 +
       fVar90 * (float)uVar38 + fVar90 * (float)uVar36 + fVar88 * (float)uVar34);
  parentMat_00->value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar90 * (float)uVar72 +
       fVar90 * (float)uVar70 + fVar90 * (float)uVar68 + fVar88 * (float)uVar66);
  parentMat_00->value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar91 * (float)uVar39 +
       fVar91 * (float)uVar37 + fVar93 * (float)uVar35 + fVar91 * (float)uVar33);
  parentMat_00->value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar91 * (float)uVar71 +
       fVar91 * (float)uVar69 + fVar93 * (float)uVar67 + fVar91 * (float)uVar65);
  parentMat_00->value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar91 * (float)uVar40 +
       fVar91 * (float)uVar38 + fVar93 * (float)uVar36 + fVar91 * (float)uVar34);
  parentMat_00->value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar91 * (float)uVar72 +
       fVar91 * (float)uVar70 + fVar93 * (float)uVar68 + fVar91 * (float)uVar66);
  parentMat_00->value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (fVar92 * (float)uVar39 +
       fVar89 * (float)uVar37 + fVar92 * (float)uVar35 + fVar92 * (float)uVar33);
  parentMat_00->value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (fVar92 * (float)uVar71 +
       fVar89 * (float)uVar69 + fVar92 * (float)uVar67 + fVar92 * (float)uVar65);
  parentMat_00->value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (fVar92 * (float)uVar40 +
       fVar89 * (float)uVar38 + fVar92 * (float)uVar36 + fVar92 * (float)uVar34);
  parentMat_00->value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (fVar92 * (float)uVar72 +
       fVar89 * (float)uVar70 + fVar92 * (float)uVar68 + fVar92 * (float)uVar66);
  parentMat_00->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       ((float)uVar37 * 0.0 + (float)uVar35 * 0.0 + (float)uVar33 * 0.0 + (float)uVar39);
  parentMat_00->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       ((float)uVar69 * 0.0 + (float)uVar67 * 0.0 + (float)uVar65 * 0.0 + (float)uVar71);
  parentMat_00->value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       ((float)uVar38 * 0.0 + (float)uVar36 * 0.0 + (float)uVar34 * 0.0 + (float)uVar40);
  parentMat_00->value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       ((float)uVar70 * 0.0 + (float)uVar68 * 0.0 + (float)uVar66 * 0.0 + (float)uVar72);
LAB_00114761:
  cVar74 = node->children_count;
  if (cVar74 != 0) {
    ppcVar75 = node->children;
    lVar87 = 0;
    do {
      node_00 = *(cgltf_node **)((long)ppcVar75 + lVar87);
      if (node_00 == (cgltf_node *)0x0) {
        __assert_fail("child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x251,
                      "void calcNodesMatricesRecursive(const cgltf_node &, const glm::mat4 &)");
      }
      calcNodesMatricesRecursive(node_00,parentMat_00);
      lVar87 = lVar87 + 8;
    } while (cVar74 << 3 != lVar87);
  }
  return;
}

Assistant:

static void calcNodesMatricesRecursive(const cgltf_node& node, const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const auto animData = anims::playingInd ? &anims::nodesData[nodeInd] : nullptr;
    glm::mat4& mtx = anims::nodesMatrices[nodeInd];
    mtx = parentMat;
    if(node.has_matrix)
        mtx *= glm::make_mat4(node.matrix);

    if(animData && animData->position)
        mtx *= glm::translate(glm::mat4(1), *animData->position);
    else if(node.has_translation)
        mtx *= glm::translate(glm::mat4(1), {node.translation[0], node.translation[1], node.translation[2]});

    if(animData && animData->rotation)
        mtx *= glm::toMat4(*animData->rotation);
    else if(node.has_rotation)
        mtx *= glm::toMat4(glm::quat(node.rotation[3], node.rotation[0], node.rotation[1], node.rotation[2]));

    if(animData && animData->scale)
        mtx *= glm::scale(glm::mat4(1), *animData->scale);
    else if(node.has_scale)
        mtx *= glm::scale(glm::mat4(1), vec3(node.scale[0], node.scale[1], node.scale[2]));

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        calcNodesMatricesRecursive(*child, mtx);
    }
}